

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManGetCiLevels(Gia_Man_t *p)

{
  int Entry;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int v;
  
  v = 0;
  if (p->vLevels == (Vec_Int_t *)0x0) {
    p_00 = (Vec_Int_t *)0x0;
  }
  else {
    p_00 = Vec_IntAlloc(p->vCis->nSize);
    for (; v < p->vCis->nSize; v = v + 1) {
      pObj = Gia_ManCi(p,v);
      if (pObj == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      Entry = Gia_ObjLevel(p,pObj);
      Vec_IntPush(p_00,Entry);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManGetCiLevels( Gia_Man_t * p )  
{
    Vec_Int_t * vCiLevels;
    Gia_Obj_t * pObj;
    int i;
    if ( p->vLevels == NULL )
        return NULL;
    vCiLevels = Vec_IntAlloc( Gia_ManCiNum(p) );
    Gia_ManForEachCi( p, pObj, i )
        Vec_IntPush( vCiLevels, Gia_ObjLevel(p, pObj) );
    return vCiLevels;
}